

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O0

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::report_race
          (Fasttrack<std::shared_mutex> *this,uint32_t thr1,uint32_t thr2,bool wr1,bool wr2,
          VarState *var,size_t address)

{
  size_t *__return_storage_ptr__;
  bool bVar1;
  pointer ppVar2;
  element_type *peVar3;
  StackTrace *pSVar4;
  size_type sVar5;
  iterator iVar6;
  iterator pvVar7;
  undefined1 local_3d8 [8];
  Race race;
  undefined1 local_258 [8];
  AccessEntry access2;
  undefined1 local_190 [8];
  AccessEntry access1;
  list<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  undefined1 local_b0 [8];
  list<unsigned_long,_std::allocator<unsigned_long>_> stack2;
  undefined1 local_80 [8];
  list<unsigned_long,_std::allocator<unsigned_long>_> stack1;
  const_iterator it_end;
  undefined1 local_50 [8];
  const_iterator it2;
  undefined1 local_38 [8];
  const_iterator it;
  VarState *var_local;
  bool wr2_local;
  bool wr1_local;
  uint32_t thr2_local;
  uint32_t thr1_local;
  Fasttrack<std::shared_mutex> *this_local;
  
  it2.inner_.field_1._4_4_ = 0;
  it2.inner_.field_1._0_4_ = thr1;
  it.inner_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)var;
  _local_38 = (iterator)
              phmap::container_internal::
              raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
              ::find<unsigned_long>
                        ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                          *)&this->threads,(key_arg<unsigned_long> *)&it2.inner_.field_1);
  it_end.inner_.field_1._4_4_ = 0;
  it_end.inner_.field_1._0_4_ = thr2;
  _local_50 = (iterator)
              phmap::container_internal::
              raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
              ::find<unsigned_long>
                        ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                          *)&this->threads,(key_arg<unsigned_long> *)&it_end.inner_.field_1);
  join_0x00000010_0x00000000_ =
       (iterator)
       phmap::container_internal::
       raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
       ::end((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
              *)&this->threads);
  bVar1 = phmap::container_internal::operator==
                    ((const_iterator *)local_38,
                     (const_iterator *)
                     &stack1.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                      ._M_node._M_size);
  if ((!bVar1) &&
     (bVar1 = phmap::container_internal::operator==
                        ((const_iterator *)local_50,
                         (const_iterator *)
                         &stack1.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl._M_node._M_size), !bVar1)) {
    ppVar2 = phmap::container_internal::
             raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
             ::const_iterator::operator->((const_iterator *)local_38);
    peVar3 = std::__shared_ptr_access<ThreadState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ThreadState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&ppVar2->second);
    pSVar4 = ThreadState::get_stackDepot(peVar3);
    __return_storage_ptr__ =
         &stack2.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
          _M_size;
    StackTrace::return_stack_trace_abi_cxx11_
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)__return_storage_ptr__,pSVar4,
               address);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_80,
               (list<unsigned_long,_std::allocator<unsigned_long>_> *)__return_storage_ptr__);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)__return_storage_ptr__);
    ppVar2 = phmap::container_internal::
             raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
             ::const_iterator::operator->((const_iterator *)local_50);
    peVar3 = std::__shared_ptr_access<ThreadState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ThreadState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&ppVar2->second);
    pSVar4 = ThreadState::get_stackDepot(peVar3);
    StackTrace::return_stack_trace_abi_cxx11_(&local_c8,pSVar4,address);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0,&local_c8);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list(&local_c8);
    while (sVar5 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::size
                             ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_80),
          0x10 < sVar5) {
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::pop_front
                ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
    }
    while (sVar5 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::size
                             ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0),
          0x10 < sVar5) {
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::pop_front
                ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
    }
    Detector::AccessEntry::AccessEntry((AccessEntry *)local_190);
    access1.heap_block_size = address;
    access1.stack_size = (size_t)*(ushort *)((long)it.inner_.field_1.slot_ + 0x1a);
    access1.write = false;
    access1.onheap = false;
    access1._2_2_ = 0;
    access1.accessed_memory = 0;
    access1.access_size = 0;
    local_190[1] = false;
    local_190[0] = wr1;
    local_190._4_4_ = thr1;
    access1._8_8_ =
         std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::size
                   ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
    iVar6 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
    access2.stack_trace._M_elems[0xf] =
         (unsigned_long)
         std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
    pvVar7 = std::array<unsigned_long,_16UL>::begin
                       ((array<unsigned_long,_16UL> *)&access1.heap_block_begin);
    std::copy<std::_List_iterator<unsigned_long>,unsigned_long*>
              ((_List_iterator<unsigned_long>)iVar6._M_node,
               (_List_iterator<unsigned_long>)access2.stack_trace._M_elems[0xf],pvVar7);
    Detector::AccessEntry::AccessEntry((AccessEntry *)local_258);
    access2.heap_block_size = address;
    access2.stack_size = (size_t)*(ushort *)((long)it.inner_.field_1.slot_ + 0x1a);
    access2.write = false;
    access2.onheap = false;
    access2._2_2_ = 0;
    access2.accessed_memory = 0;
    access2.access_size = 0;
    local_258[1] = false;
    local_258[0] = wr2;
    local_258._4_4_ = thr2;
    access2._8_8_ =
         std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::size
                   ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
    iVar6 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
    race.second.stack_trace._M_elems[0xf] =
         (unsigned_long)
         std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
    pvVar7 = std::array<unsigned_long,_16UL>::begin
                       ((array<unsigned_long,_16UL> *)&access2.heap_block_begin);
    std::copy<std::_List_iterator<unsigned_long>,unsigned_long*>
              ((_List_iterator<unsigned_long>)iVar6._M_node,
               (_List_iterator<unsigned_long>)race.second.stack_trace._M_elems[0xf],pvVar7);
    std::pair<Detector::AccessEntry,_Detector::AccessEntry>::
    pair<Detector::AccessEntry,_Detector::AccessEntry,_true>
              ((pair<Detector::AccessEntry,_Detector::AccessEntry> *)local_3d8);
    memcpy((Race *)local_3d8,local_190,0xb8);
    memcpy(race.first.stack_trace._M_elems + 0xf,local_258,0xb8);
    (*this->clb)((Race *)local_3d8,this->clb_context);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
  }
  return;
}

Assistant:

void report_race(uint32_t thr1, uint32_t thr2, bool wr1, bool wr2,
                   const VarState& var, size_t address) const {
    auto it = threads.find(thr1);
    auto it2 = threads.find(thr2);
    auto it_end = threads.end();

    if (it == it_end ||
        it2 == it_end) {  // if thread_id is, because of finishing, not in stack
                          // traces anymore, return
      return;
    }
    std::list<size_t> stack1(
        std::move(it->second->get_stackDepot().return_stack_trace(address)));
    std::list<size_t> stack2(
        std::move(it2->second->get_stackDepot().return_stack_trace(address)));

    while (stack1.size() > Detector::max_stack_size) {
      stack1.pop_front();
    }
    while (stack2.size() > Detector::max_stack_size) {
      stack2.pop_front();
    }

    Detector::AccessEntry access1;
    access1.thread_id = thr1;
    access1.write = wr1;
    access1.accessed_memory = address;
    access1.access_size = var.size;
    access1.access_type = 0;
    access1.heap_block_begin = 0;
    access1.heap_block_size = 0;
    access1.onheap = false;
    access1.stack_size = stack1.size();
    std::copy(stack1.begin(), stack1.end(), access1.stack_trace.begin());

    Detector::AccessEntry access2;
    access2.thread_id = thr2;
    access2.write = wr2;
    access2.accessed_memory = address;
    access2.access_size = var.size;
    access2.access_type = 0;
    access2.heap_block_begin = 0;
    access2.heap_block_size = 0;
    access2.onheap = false;
    access2.stack_size = stack2.size();
    std::copy(stack2.begin(), stack2.end(), access2.stack_trace.begin());

    Detector::Race race;
    race.first = access1;
    race.second = access2;

    clb(&race, clb_context);
  }